

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O1

int read_partial_array(coda_cursor_conflict *cursor,long offset,long length,void *dst)

{
  long lVar1;
  ushort *puVar2;
  undefined1 uVar3;
  coda_type_class cVar4;
  coda_backend cVar5;
  coda_dynamic_type_struct *pcVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  coda_dynamic_type_struct *pcVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  size_t __n;
  
  pcVar6 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar6[1].backend != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0x128,"int read_partial_array(const coda_cursor *, long, long, void *)");
  }
  lVar14 = (long)*(int *)((long)&pcVar6[2].definition + 4);
  pcVar10 = *(coda_dynamic_type_struct **)(pcVar6 + 2);
  if (*(coda_dynamic_type_struct **)(pcVar6 + 2) == (coda_dynamic_type_struct *)0x0) {
    pcVar10 = pcVar6;
  }
  cVar4 = pcVar10->definition->type_class;
  lVar1 = length + offset;
  iVar12 = (int)(offset / lVar14);
  iVar9 = (int)(lVar1 / lVar14);
  if (iVar12 <= iVar9) {
    cVar5 = pcVar6[3].backend;
    lVar15 = (long)iVar12;
    iVar12 = (iVar9 - iVar12) + 1;
    lVar16 = 0;
    do {
      lVar7 = *(long *)(*(long *)(pcVar6 + 4) + lVar15 * 8);
      if (lVar7 < 0) {
        bVar8 = false;
        coda_set_error(-200,"Missing record not supported for CDF variable");
      }
      else {
        lVar11 = (long)*(int *)((long)&pcVar6[2].definition + 4);
        __n = (int)cVar5 * lVar14;
        if (lVar1 < (lVar15 + 1) * lVar11) {
          __n = (long)(int)pcVar6[3].backend * (lVar1 - lVar15 * lVar11);
        }
        lVar13 = offset - lVar11 * lVar15;
        if (lVar13 == 0 || offset < lVar11 * lVar15) {
          lVar13 = 0;
        }
        else {
          lVar13 = lVar13 * (int)pcVar6[3].backend;
          __n = __n - lVar13;
        }
        if (pcVar6[4].definition == (coda_type *)0x0) {
          iVar9 = read_bytes((coda_product *)cursor->product[1].filename,lVar13 + lVar7,__n,
                             (void *)((long)dst + lVar16));
          if (iVar9 != 0) {
            bVar8 = false;
            goto LAB_00156819;
          }
        }
        else {
          memcpy((void *)((long)dst + lVar16),
                 (void *)((long)&(pcVar6[4].definition)->format + lVar13 + lVar7),__n);
        }
        lVar16 = lVar16 + __n;
        bVar8 = true;
      }
LAB_00156819:
      if (!bVar8) {
        return -1;
      }
      lVar15 = lVar15 + 1;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  if ((cVar4 != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 != 1)) {
    switch(pcVar6[3].backend) {
    case coda_backend_binary:
      break;
    case 2:
      if (0 < length) {
        lVar14 = 0;
        do {
          puVar2 = (ushort *)((long)dst + lVar14 * 2);
          *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
          lVar14 = lVar14 + 1;
        } while (length != lVar14);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                    ,0x17b,"int read_partial_array(const coda_cursor *, long, long, void *)");
    case 4:
      if (0 < length) {
        lVar14 = 0;
        do {
          uVar3 = *(undefined1 *)((long)dst + lVar14 * 4 + 3);
          *(undefined1 *)((long)dst + lVar14 * 4 + 3) = *(undefined1 *)((long)dst + lVar14 * 4);
          *(undefined1 *)((long)dst + lVar14 * 4) = uVar3;
          puVar2 = (ushort *)((long)dst + lVar14 * 4 + 1);
          *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
          lVar14 = lVar14 + 1;
        } while (length != lVar14);
      }
      break;
    case 8:
      if (0 < length) {
        do {
          swap8(dst);
          dst = (void *)((long)dst + 8);
          length = length + -1;
        } while (length != 0);
      }
    }
  }
  return 0;
}

Assistant:

static int read_partial_array(const coda_cursor *cursor, long offset, long length, void *dst)
{
    coda_netcdf_array *type;
    coda_netcdf_product *product;
    long value_size;
    long i;

    type = (coda_netcdf_array *)cursor->stack[cursor->n - 1].type;
    product = (coda_netcdf_product *)cursor->product;

    value_size = (long)(type->base_type->definition->bit_size >> 3);
    if (type->base_type->record_var)
    {
        long num_blocks = type->definition->dim[0];
        long num_values_per_block;
        int64_t target_offset;

        num_values_per_block = type->definition->num_elements / num_blocks;
        target_offset = 0;

        for (i = 0; i < num_blocks; i++)
        {
            int64_t local_offset = 0;   /* byte offset within record */
            int64_t local_size = num_values_per_block * value_size;     /* amount of bytes to read */

            if (offset + length < (i + 1) * num_values_per_block)
            {
                local_size = (offset + length - i * num_values_per_block) * value_size;
            }
            if (offset > i * num_values_per_block)
            {
                local_offset = (offset - i * num_values_per_block) * value_size;
                local_size -= local_offset;
            }
            if (read_bytes(product->raw_product, type->base_type->offset + i * product->record_size + local_offset,
                           local_size, &((uint8_t *)dst)[target_offset]) != 0)
            {
                return -1;
            }
            target_offset += local_size;
        }

    }
    else
    {
        if (read_bytes(product->raw_product, type->base_type->offset + offset * value_size, length * value_size,
                       (uint8_t *)dst) != 0)
        {
            return -1;
        }
    }

#ifndef WORDS_BIGENDIAN
    switch (type->base_type->definition->bit_size)
    {
        case 8:
            /* no endianness conversion needed */
            break;
        case 16:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap2(&((int16_t *)dst)[i]);
            }
            break;
        case 32:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap4(&((int32_t *)dst)[i]);
            }
            break;
        case 64:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap8(&((int64_t *)dst)[i]);
            }
            break;
        default:
            assert(0);
            exit(1);
    }
#endif

    return 0;
}